

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow.c
# Opt level: O0

int rewrite_branch(dmr_C *C,basic_block *bb,basic_block **ptr,basic_block *old,basic_block *new)

{
  basic_block *new_local;
  basic_block *old_local;
  basic_block **ptr_local;
  basic_block *bb_local;
  dmr_C *C_local;
  
  if (((*ptr == old) && (new != old)) && (bb->ep != (entrypoint *)0x0)) {
    C->L->repeat_phase = C->L->repeat_phase | 3;
    *ptr = new;
    dmrC_replace_bb_in_list(&bb->children,old,new,1);
    dmrC_remove_bb_from_list(&old->parents,bb,1);
    dmrC_add_bb(C,&new->parents,bb);
    C_local._4_4_ = 1;
  }
  else {
    C_local._4_4_ = 0;
  }
  return C_local._4_4_;
}

Assistant:

static int rewrite_branch(struct dmr_C *C, struct basic_block *bb,
	struct basic_block **ptr,
	struct basic_block *old,
	struct basic_block *new)
{
	if (*ptr != old || new == old || !bb->ep)
		return 0;

	/* We might find new if-conversions or non-dominating CSEs */
	/* we may also create new dead cycles */
	C->L->repeat_phase |= REPEAT_CSE | REPEAT_CFG_CLEANUP;
	*ptr = new;
	dmrC_replace_bb_in_list(&bb->children, old, new, 1);
	dmrC_remove_bb_from_list(&old->parents, bb, 1);
	dmrC_add_bb(C, &new->parents, bb);
	return 1;
}